

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O2

StringRef __thiscall mp::NameProvider::name(NameProvider *this,size_t index,size_t i2)

{
  MemoryWriter *this_00;
  pointer ppcVar1;
  char *pcVar2;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicWriter<char> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  IntFormatSpec<unsigned_long,_fmt::TypeSpec<__x00_>,_char> spec;
  StringRef SVar7;
  char *pcVar6;
  
  spec.value_ = index + 1;
  ppcVar1 = (this->names_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (spec.value_ <
      (ulong)((long)(this->names_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3)) {
    pcVar4 = ppcVar1[index];
    pcVar2 = ppcVar1[index + 1];
    pcVar6 = pcVar2 + -1;
    if ((pcVar4 < pcVar6) && (pcVar2[-2] == '\r')) {
      pcVar6 = pcVar2 + -2;
    }
    sVar5 = (long)pcVar6 - (long)pcVar4;
  }
  else {
    this_00 = &this->writer_;
    ((this->writer_).super_BasicWriter<char>.buffer_)->size_ = 0;
    if (index < i2) {
      value.data_ = (this->gen_name_)._M_dataplus._M_p;
      value.size_ = (this->gen_name_)._M_string_length;
      pBVar3 = fmt::BasicWriter<char>::operator<<(&this_00->super_BasicWriter<char>,value);
      pBVar3 = fmt::BasicWriter<char>::operator<<(pBVar3,'[');
    }
    else {
      value_00.data_ = (this->gen_name_2_)._M_dataplus._M_p;
      value_00.size_ = (this->gen_name_2_)._M_string_length;
      pBVar3 = fmt::BasicWriter<char>::operator<<(&this_00->super_BasicWriter<char>,value_00);
      pBVar3 = fmt::BasicWriter<char>::operator<<(pBVar3,'[');
      spec.value_ = spec.value_ - i2;
    }
    pBVar3 = fmt::BasicWriter<char>::operator<<(pBVar3,spec);
    fmt::BasicWriter<char>::operator<<(pBVar3,']');
    pcVar4 = fmt::BasicWriter<char>::c_str(&this_00->super_BasicWriter<char>);
    sVar5 = ((this->writer_).super_BasicWriter<char>.buffer_)->size_;
  }
  SVar7.size_ = sVar5;
  SVar7.data_ = pcVar4;
  return SVar7;
}

Assistant:

fmt::StringRef mp::NameProvider::name(
    std::size_t index, std::size_t i2) {
  if (index + 1 < names_.size()) {
    const char *name = names_[index];
    const auto* pos1past = names_[index + 1] - 1;
    assert( ('\n' == *pos1past) || ('\r' == *pos1past));
    if (pos1past>name && '\r' == *(pos1past-1))            // Windows
      --pos1past;
    return fmt::StringRef(name, pos1past - name);
  }
  writer_.clear();
  if (index>=i2)
    writer_ << gen_name_2_ << '[' << (index - i2 + 1) << ']';
  else
    writer_ << gen_name_ << '[' << (index + 1) << ']';
  return fmt::StringRef(writer_.c_str(), writer_.size());
}